

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::str::str(str *this,handle h)

{
  PyObject **ppPVar1;
  PyObject *ptr;
  error_already_set *this_00;
  handle local_20;
  str *local_18;
  str *this_local;
  handle h_local;
  
  local_18 = this;
  this_local = (str *)h.m_ptr;
  ppPVar1 = handle::ptr((handle *)&this_local);
  ptr = raw_str(*ppPVar1);
  handle::handle(&local_20,ptr);
  object::object(&this->super_object,local_20.m_ptr);
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

explicit str(handle h) : object(raw_str(h.ptr()), stolen_t{}) { if (!m_ptr) throw error_already_set(); }